

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O1

void __thiscall QToolBarLayout::checkUsePopupMenu(QToolBarLayout *this)

{
  QToolBar *this_00;
  long lVar1;
  QSize QVar2;
  int iVar3;
  bool bVar4;
  Orientation OVar5;
  long lVar6;
  QSize QVar7;
  bool set;
  long in_FS_OFFSET;
  QSize local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QToolBar **)(*(long *)&(this->super_QLayout).field_0x8 + 0x10);
  lVar6 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
  OVar5 = QToolBar::orientation(this_00);
  set = true;
  if (lVar6 != 0) {
    bVar4 = QToolBar::isFloating(this_00);
    if (!bVar4) {
      lVar1 = *(long *)(lVar6 + 0x20);
      local_38.wd.m_i = (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1;
      local_38.ht.m_i = (*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1;
      QVar7 = expandedSize(this,&local_38);
      lVar6 = *(long *)(lVar6 + 0x20);
      QVar2 = (QSize)((ulong)QVar7 >> 0x20);
      if (OVar5 == Vertical) {
        QVar2 = QVar7;
      }
      iVar3 = *(int *)(lVar6 + 0x20) - *(int *)(lVar6 + 0x18);
      if (OVar5 == Vertical) {
        iVar3 = *(int *)(lVar6 + 0x1c) - *(int *)(lVar6 + 0x14);
      }
      set = iVar3 + 1 <= QVar2.wd.m_i.m_i;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    setUsePopupMenu(this,set);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::checkUsePopupMenu()
{
    QToolBar *tb = static_cast<QToolBar *>(parent());
    QMainWindow *mw = qobject_cast<QMainWindow *>(tb->parent());
    Qt::Orientation o = tb->orientation();
    setUsePopupMenu(!mw || tb->isFloating() || perp(o, expandedSize(mw->size())) >= perp(o, mw->size()));
}